

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O1

void __thiscall enact::ParametricTypename::~ParametricTypename(ParametricTypename *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Typename *pTVar3;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ParametricTypename_00129980;
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  paVar1 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&this->m_parameterTypenames);
  pTVar3 = (this->m_constructorTypename)._M_t.
           super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
           .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  if (pTVar3 != (Typename *)0x0) {
    (*pTVar3->_vptr_Typename[1])();
  }
  (this->m_constructorTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  return;
}

Assistant:

~ParametricTypename() override = default;